

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fight.c
# Opt level: O0

void do_nerve(CHAR_DATA *ch,char *argument)

{
  bool bVar1;
  int iVar2;
  CClass *this;
  char *pcVar3;
  CHAR_DATA *in_RDI;
  float fVar4;
  float chance;
  AFFECT_DATA af;
  char arg [4608];
  CHAR_DATA *victim;
  char buf [4608];
  CHAR_DATA *in_stack_ffffffffffffdb58;
  char *__s;
  CHAR_DATA *ch_00;
  int in_stack_ffffffffffffdb68;
  char_data *in_stack_ffffffffffffdb70;
  int in_stack_ffffffffffffdb8c;
  undefined2 in_stack_ffffffffffffdb90;
  undefined2 in_stack_ffffffffffffdb92;
  undefined2 in_stack_ffffffffffffdb94;
  undefined2 in_stack_ffffffffffffdb96;
  char local_2428;
  int in_stack_ffffffffffffdc34;
  undefined1 in_stack_ffffffffffffdc3b;
  int in_stack_ffffffffffffdc3c;
  CHAR_DATA *in_stack_ffffffffffffdc40;
  int in_stack_ffffffffffffdc5c;
  CHAR_DATA *in_stack_ffffffffffffdc60;
  int in_stack_ffffffffffffdd84;
  CHAR_DATA *in_stack_ffffffffffffdd88;
  CHAR_DATA *in_stack_ffffffffffffdd90;
  char *in_stack_ffffffffffffed60;
  CHAR_DATA *in_stack_ffffffffffffed68;
  CHAR_DATA *local_1220;
  char local_1218 [4624];
  CHAR_DATA *local_8;
  
  local_8 = in_RDI;
  iVar2 = get_skill(in_stack_ffffffffffffdc60,in_stack_ffffffffffffdc5c);
  fVar4 = (float)iVar2;
  if ((fVar4 != 0.0) || (NAN(fVar4))) {
    in_stack_ffffffffffffdb68 = (int)local_8->level;
    ch_00 = (CHAR_DATA *)(skill_table + gsn_nerve);
    this = char_data::Class(in_stack_ffffffffffffdb70);
    iVar2 = CClass::GetIndex(this);
    if (*(short *)((long)&ch_00->next_in_room + (long)iVar2 * 2) <= in_stack_ffffffffffffdb68) {
      one_argument((char *)ch_00,(char *)in_stack_ffffffffffffdb58);
      if (local_2428 == '\0') {
        local_1220 = local_8->fighting;
      }
      else {
        local_1220 = get_char_room(in_stack_ffffffffffffed68,in_stack_ffffffffffffed60);
      }
      if (local_1220 == (CHAR_DATA *)0x0) {
        send_to_char((char *)in_stack_ffffffffffffdb70,
                     (CHAR_DATA *)CONCAT44(fVar4,in_stack_ffffffffffffdb68));
        return;
      }
      if (local_1220 == local_8) {
        send_to_char((char *)in_stack_ffffffffffffdb70,
                     (CHAR_DATA *)CONCAT44(fVar4,in_stack_ffffffffffffdb68));
        return;
      }
      bVar1 = is_safe(ch_00,in_stack_ffffffffffffdb58);
      if (bVar1) {
        return;
      }
      bVar1 = is_affected(local_1220,(int)gsn_nerve);
      if (bVar1) {
        send_to_char((char *)in_stack_ffffffffffffdb70,
                     (CHAR_DATA *)CONCAT44(fVar4,in_stack_ffffffffffffdb68));
        return;
      }
      fVar4 = (float)(((int)local_8->level - (int)local_1220->level) * 3) + fVar4;
      iVar2 = get_curr_stat((CHAR_DATA *)
                            CONCAT26(in_stack_ffffffffffffdb96,
                                     CONCAT24(in_stack_ffffffffffffdb94,
                                              CONCAT22(in_stack_ffffffffffffdb92,
                                                       in_stack_ffffffffffffdb90))),
                            in_stack_ffffffffffffdb8c);
      fVar4 = fVar4 - (float)(iVar2 / 3);
      iVar2 = get_curr_stat((CHAR_DATA *)
                            CONCAT26(in_stack_ffffffffffffdb96,
                                     CONCAT24(in_stack_ffffffffffffdb94,
                                              CONCAT22(in_stack_ffffffffffffdb92,
                                                       in_stack_ffffffffffffdb90))),
                            in_stack_ffffffffffffdb8c);
      fVar4 = (float)(iVar2 / 2) + fVar4;
      iVar2 = get_curr_stat((CHAR_DATA *)
                            CONCAT26(in_stack_ffffffffffffdb96,
                                     CONCAT24(in_stack_ffffffffffffdb94,
                                              CONCAT22(in_stack_ffffffffffffdb92,
                                                       in_stack_ffffffffffffdb90))),
                            in_stack_ffffffffffffdb8c);
      fVar4 = fVar4 - (float)(iVar2 / 3);
      iVar2 = number_percent();
      if (fVar4 < (float)iVar2) {
        act((char *)in_stack_ffffffffffffdb70,(CHAR_DATA *)CONCAT44(fVar4,in_stack_ffffffffffffdb68)
            ,ch_00,in_stack_ffffffffffffdb58,0);
        act((char *)in_stack_ffffffffffffdb70,(CHAR_DATA *)CONCAT44(fVar4,in_stack_ffffffffffffdb68)
            ,ch_00,in_stack_ffffffffffffdb58,0);
        act((char *)in_stack_ffffffffffffdb70,(CHAR_DATA *)CONCAT44(fVar4,in_stack_ffffffffffffdb68)
            ,ch_00,in_stack_ffffffffffffdb58,0);
        check_improve(in_stack_ffffffffffffdc40,in_stack_ffffffffffffdc3c,
                      (bool)in_stack_ffffffffffffdc3b,in_stack_ffffffffffffdc34);
        WAIT_STATE(in_stack_ffffffffffffdb70,(int)fVar4);
        return;
      }
      act((char *)in_stack_ffffffffffffdb70,(CHAR_DATA *)CONCAT44(fVar4,in_stack_ffffffffffffdb68),
          ch_00,in_stack_ffffffffffffdb58,0);
      act((char *)in_stack_ffffffffffffdb70,(CHAR_DATA *)CONCAT44(fVar4,in_stack_ffffffffffffdb68),
          ch_00,in_stack_ffffffffffffdb58,0);
      act((char *)in_stack_ffffffffffffdb70,(CHAR_DATA *)CONCAT44(fVar4,in_stack_ffffffffffffdb68),
          ch_00,in_stack_ffffffffffffdb58,0);
      check_improve(in_stack_ffffffffffffdc40,in_stack_ffffffffffffdc3c,
                    (bool)in_stack_ffffffffffffdc3b,in_stack_ffffffffffffdc34);
      init_affect((AFFECT_DATA *)0x5eb58b);
      affect_to_char(ch_00,(AFFECT_DATA *)in_stack_ffffffffffffdb58);
      WAIT_STATE(in_stack_ffffffffffffdb70,(int)fVar4);
      bVar1 = is_npc(in_stack_ffffffffffffdb58);
      if (((!bVar1) && (bVar1 = is_npc(in_stack_ffffffffffffdb58), !bVar1)) &&
         ((local_8->fighting == (CHAR_DATA *)0x0 || (local_1220->fighting == (CHAR_DATA *)0x0)))) {
        __s = local_1218;
        pcVar3 = pers((CHAR_DATA *)CONCAT44(fVar4,in_stack_ffffffffffffdb68),ch_00);
        sprintf(__s,"Help, %s is attacking me!",pcVar3);
        do_myell(in_stack_ffffffffffffdb70,(char *)CONCAT44(fVar4,in_stack_ffffffffffffdb68),ch_00);
      }
      if (local_1220->fighting != (CHAR_DATA *)0x0) {
        return;
      }
      multi_hit(in_stack_ffffffffffffdd90,in_stack_ffffffffffffdd88,in_stack_ffffffffffffdd84);
      return;
    }
  }
  send_to_char((char *)in_stack_ffffffffffffdb70,
               (CHAR_DATA *)CONCAT44(fVar4,in_stack_ffffffffffffdb68));
  return;
}

Assistant:

void do_nerve(CHAR_DATA *ch, char *argument)
{
	char buf[MAX_STRING_LENGTH];
	CHAR_DATA *victim;
	char arg[MAX_INPUT_LENGTH];
	AFFECT_DATA af;
	float chance;

	chance = get_skill(ch, gsn_nerve);

	if (chance == 0 
		|| ch->level < skill_table[gsn_nerve].skill_level[ch->Class()->GetIndex()])
	{
		send_to_char("You don't know how to use nerve pressure tactics.\n\r", ch);
		return;
	}

	one_argument(argument, arg);

	if (arg[0] == '\0')
		victim = ch->fighting;
	else
		victim = get_char_room(ch, arg);

	if (victim == nullptr)
	{
		send_to_char("Attempt to put pressure on who's nerves?\n\r", ch);
		return;
	}

	if (victim == ch)
	{
		send_to_char("You can't do that.\n\r", ch);
		return;
	}

	if (is_safe(ch, victim))
		return;

	if (is_affected(victim, gsn_nerve))
	{
		send_to_char("They have already been weakened using nerve pressure.\n\r", ch);
		return;
	}

	chance += (ch->level - victim->level) * 3;
	chance -= get_curr_stat(victim, STAT_DEX) / 3;
	chance += get_curr_stat(ch, STAT_DEX) / 2;
	chance -= get_curr_stat(victim, STAT_CON) / 3;

	if (number_percent() > chance)
	{
		act("$n grasps $N's arm but fails to apply the right pressure point.", ch, 0, victim, TO_NOTVICT);
		act("You grasp $N's arm but fail to apply the right pressure point.", ch, 0, victim, TO_CHAR);
		act("$n grasps your arm but fails to apply the right pressure point.", ch, 0, victim, TO_VICT);

		check_improve(ch, gsn_nerve, false, 3);
		WAIT_STATE(ch, PULSE_VIOLENCE);
		return;
	}
	else
	{
		act("$n grasps $N's arm and weakens $m with pressure points.", ch, 0, victim, TO_NOTVICT);
		act("You grasp $N's arm and weaken $m with pressure points.", ch, 0, victim, TO_CHAR);
		act("$n grasps your arm and weakens you with pressure point.", ch, 0, victim, TO_VICT);
		check_improve(ch, gsn_nerve, true, 3);

		init_affect(&af);
		af.where = TO_AFFECTS;
		af.type = gsn_nerve;
		af.location = APPLY_STR;
		af.duration = (ch->level / 5);
		af.modifier = -3;
		af.aftype = AFT_SKILL;
		af.level = ch->level;
		affect_to_char(victim, &af);

		WAIT_STATE(ch, PULSE_VIOLENCE);
	}

	if (!is_npc(ch) && !is_npc(victim) && (ch->fighting == nullptr || victim->fighting == nullptr))
	{
		sprintf(buf, "Help, %s is attacking me!", pers(ch, victim));
		do_myell(victim, buf, ch);
	}

	if (victim->fighting == nullptr)
	{
		multi_hit(victim, ch, TYPE_UNDEFINED);
	}
}